

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O0

PipelineResourceSignatureDescWrapper * __thiscall
Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc
          (PipelineResourceSignatureDescWrapper *__return_storage_ptr__,PipelineStateGLImpl *this,
          TShaderStages *ShaderStages,SHADER_TYPE ActiveStages)

{
  anon_class_32_4_bf853c0f HandleUB;
  anon_class_32_4_bf853c0f HandleUB_00;
  anon_class_32_4_bf853c0f HandleTexture;
  anon_class_32_4_bf853c0f HandleTexture_00;
  anon_class_32_4_bf853c0f HandleImg;
  anon_class_32_4_bf853c0f HandleImg_00;
  anon_class_32_4_bf853c0f HandleSB;
  anon_class_32_4_bf853c0f HandleSB_00;
  PIPELINE_RESOURCE_FLAGS SamplerResourceFlag;
  PipelineResourceLayoutDesc *pPVar1;
  SHADER_TYPE ShaderStages_00;
  bool bVar2;
  LinkStatus LVar3;
  ShaderGLImpl *pSVar4;
  const_reference ppSVar5;
  __shared_ptr_access<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var6;
  element_type *peVar7;
  Char *pCVar8;
  element_type *peVar9;
  __shared_ptr *this_00;
  DeviceContextGLImpl *this_01;
  GLContextState *State;
  PipelineResourceSignatureDescWrapper *Args_1;
  anon_class_4_1_7f43ddf9 local_24c;
  PipelineResourceLayoutDesc *local_248;
  PipelineResourceLayoutDesc *pPStack_240;
  unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
  *local_238;
  PipelineResourceSignatureDescWrapper *pPStack_230;
  PipelineResourceLayoutDesc *local_228;
  PipelineResourceLayoutDesc *pPStack_220;
  unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
  *local_218;
  PipelineResourceSignatureDescWrapper *pPStack_210;
  PipelineResourceLayoutDesc *local_208;
  PipelineResourceLayoutDesc *pPStack_200;
  unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
  *local_1f8;
  PipelineResourceSignatureDescWrapper *pPStack_1f0;
  PipelineResourceLayoutDesc *local_1e8;
  PipelineResourceLayoutDesc *pPStack_1e0;
  unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
  *local_1d8;
  PipelineResourceSignatureDescWrapper *pPStack_1d0;
  PIPELINE_RESOURCE_FLAGS local_1c1;
  undefined1 local_1c0 [7];
  PIPELINE_RESOURCE_FLAGS SamplerResFlag;
  string msg_1;
  string msg;
  RefCntAutoPtr<Diligent::DeviceContextGLImpl> pImmediateCtx;
  ShaderGLImpl *pShaderGL;
  size_t i;
  anon_class_32_4_bf853c0f HandleResource;
  unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
  UniqueResources;
  PipelineResourceSignatureDesc local_78;
  byte local_31;
  PipelineResourceLayoutDesc *local_30;
  PipelineResourceLayoutDesc *ResourceLayout;
  TShaderStages *pTStack_20;
  SHADER_TYPE ActiveStages_local;
  TShaderStages *ShaderStages_local;
  PipelineStateGLImpl *this_local;
  PipelineResourceSignatureDescWrapper *SignDesc;
  
  local_30 = &(this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
              super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
              .m_Desc.ResourceLayout;
  local_31 = 0;
  ResourceLayout._4_4_ = ActiveStages;
  pTStack_20 = ShaderStages;
  ShaderStages_local = (TShaderStages *)this;
  this_local = (PipelineStateGLImpl *)__return_storage_ptr__;
  PipelineResourceSignatureDescWrapper::PipelineResourceSignatureDescWrapper
            (__return_storage_ptr__,
             (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
             super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
             .m_Desc.super_DeviceObjectAttribs.Name,local_30,
             (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
             super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
             .m_Desc.SRBAllocationGranularity);
  local_78.NumImmutableSamplers = 0;
  local_78.BindingIndex = '\0';
  local_78.UseCombinedTextureSamplers = false;
  local_78._38_2_ = 0;
  local_78.CombinedSamplerSuffix = (char *)0x0;
  local_78.NumResources = 0;
  local_78._20_4_ = 0;
  local_78.ImmutableSamplers = (ImmutableSamplerDesc *)0x0;
  local_78.super_DeviceObjectAttribs.Name = (Char *)0x0;
  local_78.Resources = (PipelineResourceDesc *)0x0;
  local_78.SRBAllocationGranularity = 0;
  local_78._52_4_ = 0;
  PipelineResourceSignatureDesc::PipelineResourceSignatureDesc(&local_78);
  PipelineResourceSignatureDescWrapper::SetCombinedSamplerSuffix
            (__return_storage_ptr__,local_78.CombinedSamplerSuffix);
  std::
  unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
  ::unordered_map((unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
                   *)&HandleResource.this);
  pPVar1 = local_30;
  HandleResource.ResourceLayout = (PipelineResourceLayoutDesc *)&HandleResource.this;
  HandleResource.UniqueResources =
       (unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
        *)__return_storage_ptr__;
  HandleResource.SignDesc = (PipelineResourceSignatureDescWrapper *)this;
  if ((this->m_IsProgramPipelineSupported & 1U) != 0) {
    for (pShaderGL = (ShaderGLImpl *)0x0;
        pSVar4 = (ShaderGLImpl *)
                 std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>::
                 size(pTStack_20), pShaderGL < pSVar4;
        pShaderGL = (ShaderGLImpl *)
                    ((long)&(pShaderGL->super_ShaderBase<Diligent::EngineGLImplTraits>).
                            super_DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
                            .super_ObjectBase<Diligent::IShaderGL>.
                            super_RefCountedObject<Diligent::IShaderGL>.super_IShaderGL.
                            super_IShader.super_IDeviceObject + 1)) {
      ppSVar5 = std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>::
                operator[](pTStack_20,(size_type)pShaderGL);
      p_Var6 = (__shared_ptr_access<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)ShaderGLImpl::GetShaderResources(*ppSVar5);
      peVar7 = std::
               __shared_ptr_access<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var6);
      HandleUB.UniqueResources =
           (unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
            *)HandleResource.ResourceLayout;
      HandleUB.ResourceLayout = pPVar1;
      HandleUB.SignDesc = (PipelineResourceSignatureDescWrapper *)HandleResource.UniqueResources;
      HandleUB.this = (PipelineStateGLImpl *)HandleResource.SignDesc;
      HandleTexture.UniqueResources =
           (unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
            *)HandleResource.ResourceLayout;
      HandleTexture.ResourceLayout = pPVar1;
      HandleTexture.SignDesc =
           (PipelineResourceSignatureDescWrapper *)HandleResource.UniqueResources;
      HandleTexture.this = (PipelineStateGLImpl *)HandleResource.SignDesc;
      HandleImg.UniqueResources =
           (unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
            *)HandleResource.ResourceLayout;
      HandleImg.ResourceLayout = pPVar1;
      HandleImg.SignDesc = (PipelineResourceSignatureDescWrapper *)HandleResource.UniqueResources;
      HandleImg.this = (PipelineStateGLImpl *)HandleResource.SignDesc;
      HandleSB.UniqueResources =
           (unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
            *)HandleResource.ResourceLayout;
      HandleSB.ResourceLayout = pPVar1;
      HandleSB.SignDesc = (PipelineResourceSignatureDescWrapper *)HandleResource.UniqueResources;
      HandleSB.this = (PipelineStateGLImpl *)HandleResource.SignDesc;
      ShaderResourcesGL::
      ProcessConstResources<Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0,Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0,Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0,Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0>
                (peVar7,HandleUB,HandleTexture,HandleImg,HandleSB,(PipelineResourceLayoutDesc *)0x0,
                 (SHADER_RESOURCE_VARIABLE_TYPE *)0x0,0);
    }
    goto LAB_001db89e;
  }
  Args_1 = __return_storage_ptr__;
  RenderDeviceBase<Diligent::EngineGLImplTraits>::GetImmediateContext
            ((RenderDeviceBase<Diligent::EngineGLImplTraits> *)((long)&msg.field_2 + 8),
             (size_t)(this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
                     super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                     .m_pDevice);
  bVar2 = RefCntAutoPtr<Diligent::DeviceContextGLImpl>::operator!
                    ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)((long)&msg.field_2 + 8));
  if (bVar2) {
    FormatString<char[26],char[14]>
              ((string *)((long)&msg_1.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pImmediateCtx",(char (*) [14])Args_1);
    pCVar8 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (PipelineResourceSignatureDescWrapper *)0x90;
    DebugAssertionFailed
              (pCVar8,"GetDefaultSignatureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x90);
    std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
  }
  bVar2 = std::operator!=(this->m_GLPrograms,(nullptr_t)0x0);
  if (bVar2) {
    peVar9 = std::__shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this->m_GLPrograms);
    LVar3 = GLProgram::GetLinkStatus(peVar9,false);
    if (LVar3 != Succeeded) goto LAB_001db5f5;
  }
  else {
LAB_001db5f5:
    FormatString<char[26],char[99]>
              ((string *)local_1c0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_GLPrograms[0] != nullptr && m_GLPrograms[0]->GetLinkStatus() == GLProgram::LinkStatus::Succeeded"
               ,(char (*) [99])Args_1);
    pCVar8 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar8,"GetDefaultSignatureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x91);
    std::__cxx11::string::~string((string *)local_1c0);
  }
  peVar9 = std::__shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this->m_GLPrograms);
  this_00 = (__shared_ptr *)GLProgram::GetResources(peVar9);
  bVar2 = std::__shared_ptr::operator_cast_to_bool(this_00);
  if (!bVar2) {
    local_1c1 = GetSamplerResourceFlag(this,pTStack_20,true);
    peVar9 = std::__shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this->m_GLPrograms);
    ShaderStages_00 = ResourceLayout._4_4_;
    SamplerResourceFlag = local_1c1;
    this_01 = RefCntAutoPtr<Diligent::DeviceContextGLImpl>::operator->
                        ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)((long)&msg.field_2 + 8));
    State = DeviceContextGLImpl::GetContextState(this_01);
    GLProgram::LoadResources
              (peVar9,ShaderStages_00,SamplerResourceFlag,State,false,SHADER_SOURCE_LANGUAGE_DEFAULT
              );
  }
  peVar9 = std::__shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this->m_GLPrograms);
  p_Var6 = (__shared_ptr_access<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)GLProgram::GetResources(peVar9);
  peVar7 = std::
           __shared_ptr_access<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var6);
  local_1d8 = HandleResource.UniqueResources;
  pPStack_1d0 = HandleResource.SignDesc;
  local_1e8 = pPVar1;
  pPStack_1e0 = HandleResource.ResourceLayout;
  local_1f8 = HandleResource.UniqueResources;
  pPStack_1f0 = HandleResource.SignDesc;
  local_208 = pPVar1;
  pPStack_200 = HandleResource.ResourceLayout;
  local_218 = HandleResource.UniqueResources;
  pPStack_210 = HandleResource.SignDesc;
  local_228 = pPVar1;
  pPStack_220 = HandleResource.ResourceLayout;
  local_238 = HandleResource.UniqueResources;
  pPStack_230 = HandleResource.SignDesc;
  local_248 = pPVar1;
  pPStack_240 = HandleResource.ResourceLayout;
  HandleUB_00.UniqueResources =
       (unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
        *)HandleResource.ResourceLayout;
  HandleUB_00.ResourceLayout = pPVar1;
  HandleUB_00.SignDesc = (PipelineResourceSignatureDescWrapper *)HandleResource.UniqueResources;
  HandleUB_00.this = (PipelineStateGLImpl *)HandleResource.SignDesc;
  HandleTexture_00.UniqueResources =
       (unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
        *)HandleResource.ResourceLayout;
  HandleTexture_00.ResourceLayout = pPVar1;
  HandleTexture_00.SignDesc = (PipelineResourceSignatureDescWrapper *)HandleResource.UniqueResources
  ;
  HandleTexture_00.this = (PipelineStateGLImpl *)HandleResource.SignDesc;
  HandleImg_00.UniqueResources =
       (unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
        *)HandleResource.ResourceLayout;
  HandleImg_00.ResourceLayout = pPVar1;
  HandleImg_00.SignDesc = (PipelineResourceSignatureDescWrapper *)HandleResource.UniqueResources;
  HandleImg_00.this = (PipelineStateGLImpl *)HandleResource.SignDesc;
  HandleSB_00.UniqueResources =
       (unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
        *)HandleResource.ResourceLayout;
  HandleSB_00.ResourceLayout = pPVar1;
  HandleSB_00.SignDesc = (PipelineResourceSignatureDescWrapper *)HandleResource.UniqueResources;
  HandleSB_00.this = (PipelineStateGLImpl *)HandleResource.SignDesc;
  ShaderResourcesGL::
  ProcessConstResources<Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0,Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0,Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0,Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0>
            (peVar7,HandleUB_00,HandleTexture_00,HandleImg_00,HandleSB_00,
             (PipelineResourceLayoutDesc *)0x0,(SHADER_RESOURCE_VARIABLE_TYPE *)0x0,0);
  if (local_30->NumImmutableSamplers != 0) {
    local_24c.ActiveStages = ResourceLayout._4_4_;
    PipelineResourceSignatureDescWrapper::
    ProcessImmutableSamplers<Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__1>
              (__return_storage_ptr__,&local_24c);
  }
  RefCntAutoPtr<Diligent::DeviceContextGLImpl>::~RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)((long)&msg.field_2 + 8));
LAB_001db89e:
  local_31 = 1;
  std::
  unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
  ::~unordered_map((unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
                    *)&HandleResource.this);
  if ((local_31 & 1) == 0) {
    PipelineResourceSignatureDescWrapper::~PipelineResourceSignatureDescWrapper
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

PipelineResourceSignatureDescWrapper PipelineStateGLImpl::GetDefaultSignatureDesc(
    const TShaderStages& ShaderStages,
    SHADER_TYPE          ActiveStages)
{
    const auto& ResourceLayout = m_Desc.ResourceLayout;

    PipelineResourceSignatureDescWrapper SignDesc{m_Desc.Name, ResourceLayout, m_Desc.SRBAllocationGranularity};
    SignDesc.SetCombinedSamplerSuffix(PipelineResourceSignatureDesc{}.CombinedSamplerSuffix);

    std::unordered_map<ShaderResourceHashKey, const ShaderResourcesGL::GLResourceAttribs&, ShaderResourceHashKey::Hasher> UniqueResources;

    const auto HandleResource = [&](const ShaderResourcesGL::GLResourceAttribs& Attribs) //
    {
        const auto VarDesc     = FindPipelineResourceLayoutVariable(ResourceLayout, Attribs.Name, Attribs.ShaderStages, nullptr);
        const auto it_assigned = UniqueResources.emplace(ShaderResourceHashKey{VarDesc.ShaderStages, Attribs.Name}, Attribs);
        if (it_assigned.second)
        {
            const auto Flags = Attribs.ResourceFlags | ShaderVariableFlagsToPipelineResourceFlags(VarDesc.Flags);
            SignDesc.AddResource(VarDesc.ShaderStages, Attribs.Name, Attribs.ArraySize, Attribs.ResourceType, VarDesc.Type, Flags);
        }
        else
        {
            VerifyResourceMerge(m_Desc, it_assigned.first->second, Attribs);
        }
    };

    if (m_IsProgramPipelineSupported)
    {
        for (size_t i = 0; i < ShaderStages.size(); ++i)
        {
            ShaderGLImpl* pShaderGL = ShaderStages[i];
            pShaderGL->GetShaderResources()->ProcessConstResources(HandleResource, HandleResource, HandleResource, HandleResource);
        }
    }
    else
    {
        auto pImmediateCtx = m_pDevice->GetImmediateContext(0);
        VERIFY_EXPR(pImmediateCtx);
        VERIFY_EXPR(m_GLPrograms[0] != nullptr && m_GLPrograms[0]->GetLinkStatus() == GLProgram::LinkStatus::Succeeded);

        if (!m_GLPrograms[0]->GetResources())
        {
            // Load resources first time this program is used
            const auto SamplerResFlag = GetSamplerResourceFlag(ShaderStages, true /*SilenceWarning*/);
            m_GLPrograms[0]->LoadResources(
                ActiveStages,
                SamplerResFlag,
                pImmediateCtx->GetContextState());
        }
        m_GLPrograms[0]->GetResources()->ProcessConstResources(HandleResource, HandleResource, HandleResource, HandleResource);

        if (ResourceLayout.NumImmutableSamplers > 0)
        {
            // Apply each immutable sampler to all shader stages
            SignDesc.ProcessImmutableSamplers(
                [ActiveStages](ImmutableSamplerDesc& SamDesc) //
                {
                    SamDesc.ShaderStages = ActiveStages;
                });
        }
    }

    return SignDesc;
}